

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream_encoder_mt.c
# Opt level: O0

lzma_ret initialize_new_thread(lzma_stream_coder_conflict1 *coder,lzma_allocator *allocator)

{
  int iVar1;
  uint8_t *puVar2;
  lzma_next_coder *__dest;
  undefined1 local_70 [8];
  undefined8 local_68;
  worker_thread *local_28;
  worker_thread *thr;
  lzma_allocator *allocator_local;
  lzma_stream_coder_conflict1 *coder_local;
  
  local_28 = coder->threads + coder->threads_initialized;
  thr = (worker_thread *)allocator;
  allocator_local = (lzma_allocator *)coder;
  puVar2 = (uint8_t *)lzma_alloc(coder->block_size,allocator);
  local_28->in = puVar2;
  if (local_28->in != (uint8_t *)0x0) {
    iVar1 = mythread_mutex_init(&local_28->mutex);
    if (iVar1 == 0) {
      iVar1 = mythread_cond_init(&local_28->cond);
      if (iVar1 == 0) {
        local_28->state = THR_IDLE;
        local_28->allocator = (lzma_allocator *)thr;
        local_28->coder = (lzma_stream_coder_conflict1 *)allocator_local;
        local_28->progress_in = 0;
        local_28->progress_out = 0;
        __dest = &local_28->block_encoder;
        memset(local_70,0,0x48);
        local_68 = 0xffffffffffffffff;
        memcpy(__dest,local_70,0x48);
        iVar1 = mythread_create(&local_28->thread_id,worker_start,local_28);
        if (iVar1 == 0) {
          *(int *)((long)&allocator_local[0xd].free + 4) =
               *(int *)((long)&allocator_local[0xd].free + 4) + 1;
          allocator_local[0xe].alloc = (_func_void_ptr_void_ptr_size_t_size_t *)local_28;
          return LZMA_OK;
        }
        mythread_cond_destroy(&local_28->cond);
      }
      mythread_mutex_destroy(&local_28->mutex);
    }
    lzma_free(local_28->in,(lzma_allocator *)thr);
  }
  return LZMA_MEM_ERROR;
}

Assistant:

static lzma_ret
initialize_new_thread(lzma_stream_coder *coder,
		const lzma_allocator *allocator)
{
	worker_thread *thr = &coder->threads[coder->threads_initialized];

	thr->in = lzma_alloc(coder->block_size, allocator);
	if (thr->in == NULL)
		return LZMA_MEM_ERROR;

	if (mythread_mutex_init(&thr->mutex))
		goto error_mutex;

	if (mythread_cond_init(&thr->cond))
		goto error_cond;

	thr->state = THR_IDLE;
	thr->allocator = allocator;
	thr->coder = coder;
	thr->progress_in = 0;
	thr->progress_out = 0;
	thr->block_encoder = LZMA_NEXT_CODER_INIT;

	if (mythread_create(&thr->thread_id, &worker_start, thr))
		goto error_thread;

	++coder->threads_initialized;
	coder->thr = thr;

	return LZMA_OK;

error_thread:
	mythread_cond_destroy(&thr->cond);

error_cond:
	mythread_mutex_destroy(&thr->mutex);

error_mutex:
	lzma_free(thr->in, allocator);
	return LZMA_MEM_ERROR;
}